

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O1

void deleteForeign(string *val)

{
  ostream *poVar1;
  assertion_result local_68;
  const_string local_50;
  char *local_40;
  char *local_38;
  lazy_ostream local_30;
  undefined8 *local_20;
  char **local_18;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Deleting foreign string containing ",0x23);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(val->_M_dataplus)._M_p,val->_M_string_length);
  local_30._vptr_lazy_ostream = (_func_int **)CONCAT71(local_30._vptr_lazy_ostream._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_30,1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x40c;
  local_68.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)safeToDelete;
  local_68.m_message.px = (element_type *)0x0;
  local_68.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_40;
  local_40 = "safeToDelete";
  local_38 = "";
  local_30.m_empty = false;
  local_30._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ddaf8;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_50.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_68,&local_30,&local_50,0x40c,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_68.m_message.pn);
  return;
}

Assistant:

void deleteForeign(const std::string &val) 
{
    std::cout << "Deleting foreign string containing " << val << '\n';
    BOOST_CHECK(safeToDelete);
}